

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbaseconfig.cpp
# Opt level: O0

void __thiscall MBaseConfig::save(MBaseConfig *this,QString *fileName,Format *format)

{
  bool bVar1;
  QSettings local_58 [8];
  QSettings settings_1;
  QSettings local_38 [8];
  QSettings settings;
  anon_class_8_1_8991fb9c local_28;
  anon_class_8_1_8991fb9c saveTo;
  Format *format_local;
  QString *fileName_local;
  MBaseConfig *this_local;
  
  local_28.this = this;
  saveTo.this = (MBaseConfig *)format;
  bVar1 = QString::isNull(fileName);
  if (bVar1) {
    QSettings::QSettings(local_38,(QObject *)0x0);
    save::anon_class_8_1_8991fb9c::operator()(&local_28,local_38);
    QSettings::~QSettings(local_38);
  }
  else {
    QSettings::QSettings
              (local_58,(QString *)fileName,*(Format *)&(saveTo.this)->_vptr_MBaseConfig,
               (QObject *)0x0);
    save::anon_class_8_1_8991fb9c::operator()(&local_28,local_58);
    QSettings::~QSettings(local_58);
  }
  return;
}

Assistant:

void MBaseConfig::save(const QString &fileName, const QSettings::Format &format)
{
    auto saveTo = [this](QSettings &settings) {
        settings.beginGroup(m_groupName);
        const auto &values = valueNames();
        for (auto key : values) {
            auto val = value(key);
#ifdef ENCRYPTED_CONFIG
            if (m_passphrase.size()) {
                key = m_crypto.encrypt(key, m_passphrase);
                val = m_crypto.encrypt(val.toByteArray(), m_passphrase);
            }
#endif
            settings.setValue(key, val);
        }
    };

    if (fileName.isNull()) {
        QSettings settings;
        saveTo(settings);
    } else {
        QSettings settings(fileName, format);
        saveTo(settings);
    }
}